

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::CE_parse_argument(int key,char *arg,argp_state *state)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  double dVar3;
  Arguments *theArgumentsStruc;
  
  lVar1 = *(long *)(in_RDX + 0x28);
  if (in_EDI == 1) {
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x180) = (long)iVar2;
  }
  else if (in_EDI == 2) {
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x1b0) = (long)iVar2;
  }
  else if (in_EDI == 0x4e) {
    *(undefined1 *)(lVar1 + 0x1a0) = 0;
  }
  else if (in_EDI == 0x61) {
    dVar3 = atof(in_RSI);
    *(double *)(lVar1 + 0x1a8) = dVar3;
  }
  else if (in_EDI == 0x69) {
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x188) = (long)iVar2;
  }
  else if (in_EDI == 0x6e) {
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 400) = (long)iVar2;
  }
  else {
    if (in_EDI != 0x75) {
      return 7;
    }
    iVar2 = atoi(in_RSI);
    *(long *)(lVar1 + 0x198) = (long)iVar2;
  }
  return 0;
}

Assistant:

error_t
CE_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
    case CE_EVALUATION_RUNS:
        theArgumentsStruc->nrCEEvaluationRuns = atoi(arg);
        break;
    case CE_RESTARTS:
        theArgumentsStruc->nrCERestarts = atoi(arg);
        break;
    case 'i':
        theArgumentsStruc->nrCEIterations =  atoi(arg);
        break;
    case 'n':
        theArgumentsStruc->nrCESamples =  atoi(arg);
        break;
    case 'u':
        theArgumentsStruc->nrCESamplesForUpdate =  atoi(arg);
        break;
    case 'N':
        theArgumentsStruc->CE_use_hard_threshold = 0;
        break;
    case 'a':
        theArgumentsStruc->CE_alpha =  atof(arg);
        break;
    default:
        return ARGP_ERR_UNKNOWN;
    }
    return 0;
}